

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

string * formatString<char_const*,int,int>
                   (string *__return_storage_ptr__,char *fmt,char *args,int args_1,int args_2)

{
  ulong __maxlen;
  int iVar1;
  tuple<char_*,_std::default_delete<char[]>_> __s;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  iVar1 = snprintf((char *)0x0,0,fmt,args,(ulong)(uint)args_1,(ulong)(uint)args_2);
  __maxlen = (long)iVar1 + 1;
  __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__maxlen);
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  snprintf((char *)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,__maxlen,fmt,args,
           (ulong)(uint)args_1,(ulong)(uint)args_2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)((long)iVar1 +
                     (long)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl));
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string formatString(const char* fmt, Args... args) {
    // Determine required size (+1 for '\0')
    size_t size = snprintf(nullptr, 0, fmt, args...) + 1;
    // Allocate necessary buffer
    std::unique_ptr<char[]> buffer(new char[size]);

    // Write string format to buffer
    snprintf(buffer.get(), size, fmt, args...);
    return std::string(buffer.get(), buffer.get() + size - 1);
}